

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O1

void __thiscall Cache::setByteCopy(Cache *this,uint32_t addr,uint8_t val,uint32_t *cycles)

{
  pointer pBVar1;
  sbyte sVar2;
  byte extraout_AL;
  byte extraout_AL_00;
  uint32_t uVar3;
  Cache *this_00;
  double __x;
  double __x_00;
  double __x_01;
  
  while( true ) {
    this_00 = this;
    uVar3 = getBlockId(this_00,addr);
    if (uVar3 != 0xffffffff) {
      log2(__x);
      sVar2 = (extraout_AL < 0x21) * (' ' - extraout_AL);
      pBVar1 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pBVar1[(int)uVar3].dirty = true;
      *(uint8_t *)
       (*(long *)&pBVar1[(int)uVar3].data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + (ulong)((addr << sVar2) >> sVar2)) = val;
      if (this_00->write_back != false) {
        return;
      }
      writeBlockToLowerLevel
                (this_00,(this_00->blocks).
                         super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)uVar3,cycles);
      return;
    }
    if (this_00->write_allocate != false) break;
    this = this_00->lower_cache;
    if (this_00->lower_cache == (Cache *)0x0) {
      MemoryManager::setByteNoCache(this_00->memory,addr,val);
      return;
    }
  }
  loadBlockFromLowerLevel(this_00,addr,cycles);
  uVar3 = getBlockId(this_00,addr);
  if (uVar3 != 0xffffffff) {
    log2(__x_00);
    sVar2 = (extraout_AL_00 < 0x21) * (' ' - extraout_AL_00);
    pBVar1 = (this_00->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pBVar1[(int)uVar3].dirty = true;
    *(uint8_t *)
     (*(long *)&pBVar1[(int)uVar3].data.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + (ulong)((addr << sVar2) >> sVar2)) = val;
    return;
  }
  setByteCopy();
  log2(__x_01);
  return;
}

Assistant:

void Cache::setByteCopy(uint32_t addr, uint8_t val, uint32_t *cycles) {
    int block_id;
    if ((block_id = this->getBlockId(addr)) != -1) {
        //in cache
        uint32_t offset = this->getOffset(addr);
        this->blocks[block_id].dirty = true;
        this->blocks[block_id].data[offset] = val;
        if (!this->write_back) {
            this->writeBlockToLowerLevel(this->blocks[block_id], cycles);
        }
        return;
    }

    if (!this->write_allocate) {
        if (this->lower_cache == nullptr) {
            this->memory->setByteNoCache(addr, val);
        } else {
            this->lower_cache->setByteCopy(addr, val, cycles);
        }
    } else {
        this->loadBlockFromLowerLevel(addr, cycles);
        if ((block_id = this->getBlockId(addr)) != -1) {
            uint32_t offset = this->getOffset(addr);
            this->blocks[block_id].dirty = true;
            this->blocks[block_id].data[offset] = val;
            return;
        } else {
            fprintf(stderr, "Error: data should in top level cache, but it seems not\n");
            exit(-1);
        }
    }
}